

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_get_available_frames
                    (ma_audio_buffer *pAudioBuffer,ma_uint64 *pAvailableFrames)

{
  ma_uint64 *in_RSI;
  ma_audio_buffer_ref *in_RDI;
  undefined4 local_4;
  
  if (in_RSI == (ma_uint64 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    if (in_RDI == (ma_audio_buffer_ref *)0x0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      local_4 = ma_audio_buffer_ref_get_available_frames(in_RDI,in_RSI);
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_audio_buffer_get_available_frames(const ma_audio_buffer* pAudioBuffer, ma_uint64* pAvailableFrames)
{
    if (pAvailableFrames == NULL) {
        return MA_INVALID_ARGS;
    }

    *pAvailableFrames = 0;

    if (pAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    return ma_audio_buffer_ref_get_available_frames(&pAudioBuffer->ref, pAvailableFrames);
}